

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::ReadConf(CSocekt *this)

{
  int iVar1;
  int iVar2;
  Config *pCVar3;
  
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(pCVar3,"worker_connections",1);
  this->m_worker_connections = iVar1;
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(pCVar3,"ListenPortCount",1);
  this->m_ListenPortCount = iVar1;
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(pCVar3,"Sock_WaitTimeEnable",0);
  this->m_ifkickTimeCount = iVar1;
  pCVar3 = flyd::Singleton<flyd::Config>::getInstance();
  iVar2 = flyd::Config::GetIntDefault(pCVar3,"Sock_MaxWaitTime",this->m_iWaitTime);
  iVar1 = 5;
  if (5 < iVar2) {
    iVar1 = iVar2;
  }
  this->m_iWaitTime = iVar1;
  return;
}

Assistant:

void CSocekt::ReadConf()
{
 //   CConfig *p_config = CConfig::GetInstance();
    m_worker_connections = Singleton<Config>::getInstance().GetIntDefault("worker_connections", 1);
  //  m_worker_connections = p_config->GetIntDefault("worker_connections",m_worker_connections); //epoll连接的最大项数
  //  m_ListenPortCount    = p_config->GetIntDefault("ListenPortCount",m_ListenPortCount);       //取得要监听的端口数量
    m_ListenPortCount = Singleton<Config>::getInstance().GetIntDefault("ListenPortCount", 1);
    //LOG_DEBUG << "worker_connections = " << m_worker_connections << "ListenPortCount = " << m_ListenPortCount;

    m_ifkickTimeCount   =  Singleton<Config>::getInstance().GetIntDefault("Sock_WaitTimeEnable", 0);
    m_iWaitTime         =  Singleton<Config>::getInstance().GetIntDefault("Sock_MaxWaitTime", m_iWaitTime);
    m_iWaitTime         =  (m_iWaitTime > 5) ? m_iWaitTime : 5;

}